

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
* __thiscall
linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::Take
          (IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
          *this,size_t count)

{
  TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int> local_70;
  
  TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>::TakeState
            (&local_70,&this->source,count);
  IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  ::IEnumerableCore(__return_storage_ptr__,&local_70);
  local_70.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157978;
  local_70.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_001571a0;
  local_70.source.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_70.source.source2.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.source.source2.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_70.source.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_70.source.source1.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.source.source1.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Take(size_t count) 
		{ 
			return IEnumerableCore<TakeState<S, T>>(
				TakeState<S, T>(std::move(source), count)
			);
		}